

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_iso9660_zisofs.c
# Opt level: O0

void test_write_format_iso9660_zisofs_2(void)

{
  int iVar1;
  mode_t mVar2;
  la_ssize_t lVar3;
  time_t tVar4;
  time_t tVar5;
  char *pcVar6;
  la_int64_t lVar7;
  int local_83c;
  int j;
  int r;
  uint i;
  size_t used;
  size_t buffsize;
  uchar *buff;
  archive_entry *ae;
  archive *a;
  uchar data [1024];
  uchar buff2 [1024];
  
  used = 0x1e000;
  buffsize = (size_t)malloc(0x1e000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                   ,L'Ŕ',(uint)((void *)buffsize != (void *)0x0),"buff != NULL",(void *)0x0);
  if (buffsize != 0) {
    ae = (archive_entry *)archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                     ,L'ř',(uint)(ae != (archive_entry *)0x0),"(a = archive_write_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_write_set_format_iso9660((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                        ,L'Ś',0,"0",(long)iVar1,"archive_write_set_format_iso9660(a)",ae);
    iVar1 = archive_write_add_filter_none((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                        ,L'ś',0,"0",(long)iVar1,"archive_write_add_filter_none(a)",ae);
    iVar1 = archive_write_set_option((archive *)ae,(char *)0x0,"zisofs","1");
    if (iVar1 == -0x1e) {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                     ,L'Ş');
      test_skipping("zisofs option not supported on this platform");
      iVar1 = archive_write_free((archive *)ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ş',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      free((void *)buffsize);
    }
    else {
      iVar1 = archive_write_set_option((archive *)ae,(char *)0x0,"pad",(char *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ţ',0,"0",(long)iVar1,
                          "archive_write_set_option(a, NULL, \"pad\", NULL)",ae);
      iVar1 = archive_write_open_memory((archive *)ae,(void *)buffsize,used,(size_t *)&r);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ť',0,"0",(long)iVar1,
                          "archive_write_open_memory(a, buff, buffsize, &used)",ae);
      buff = (uchar *)archive_entry_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                       ,L'ũ',(uint)((archive_entry *)buff != (archive_entry *)0x0),
                       "(ae = archive_entry_new()) != NULL",(void *)0x0);
      archive_entry_set_atime((archive_entry *)buff,2,0x14);
      archive_entry_set_birthtime((archive_entry *)buff,3,0x1e);
      archive_entry_set_ctime((archive_entry *)buff,4,0x28);
      archive_entry_set_mtime((archive_entry *)buff,5,0x32);
      archive_entry_copy_pathname((archive_entry *)buff,"file1");
      archive_entry_set_mode((archive_entry *)buff,0x81ed);
      archive_entry_set_size((archive_entry *)buff,0x40000);
      iVar1 = archive_write_header((archive *)ae,(archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ű',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",ae);
      archive_entry_free((archive_entry *)buff);
      for (j = 0; (uint)j < 0x100; j = j + 1) {
        if (j == 0) {
          for (local_83c = 0; local_83c < 0x400; local_83c = local_83c + 1) {
            data[(long)local_83c + -8] = (byte)j ^ (byte)local_83c;
          }
        }
        else {
          for (local_83c = 0; local_83c < 0x400; local_83c = local_83c + 1) {
            data[(long)local_83c + -8] = data[(long)local_83c + -8] ^ (byte)j + (char)local_83c;
          }
        }
        lVar3 = archive_write_data((archive *)ae,&a,0x400);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                            ,L'ż',0x400,"1024",lVar3,"archive_write_data(a, data, 1024)",ae);
      }
      buff = (uchar *)archive_entry_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                       ,L'Ƃ',(uint)((archive_entry *)buff != (archive_entry *)0x0),
                       "(ae = archive_entry_new()) != NULL",(void *)0x0);
      archive_entry_set_atime((archive_entry *)buff,2,0x14);
      archive_entry_set_birthtime((archive_entry *)buff,3,0x1e);
      archive_entry_set_ctime((archive_entry *)buff,4,0x28);
      archive_entry_set_mtime((archive_entry *)buff,5,0x32);
      archive_entry_copy_pathname((archive_entry *)buff,"file2");
      archive_entry_set_mode((archive_entry *)buff,0x81ed);
      archive_entry_set_size((archive_entry *)buff,0x800);
      iVar1 = archive_write_header((archive *)ae,(archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ɗ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",ae);
      archive_entry_free((archive_entry *)buff);
      memset(&a,0x61,0x400);
      lVar3 = archive_write_data((archive *)ae,&a,0x400);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ƍ',0x400,"1024",lVar3,"archive_write_data(a, data, 1024)",ae);
      memset(&a,0x62,0x400);
      lVar3 = archive_write_data((archive *)ae,&a,0x400);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ə',0x400,"1024",lVar3,"archive_write_data(a, data, 1024)",ae);
      buff = (uchar *)archive_entry_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                       ,L'ƕ',(uint)((archive_entry *)buff != (archive_entry *)0x0),
                       "(ae = archive_entry_new()) != NULL",(void *)0x0);
      archive_entry_set_atime((archive_entry *)buff,2,0x14);
      archive_entry_set_birthtime((archive_entry *)buff,3,0x1e);
      archive_entry_set_ctime((archive_entry *)buff,4,0x28);
      archive_entry_set_mtime((archive_entry *)buff,5,0x32);
      archive_entry_copy_pathname((archive_entry *)buff,"file3");
      archive_entry_set_mode((archive_entry *)buff,0x81ed);
      archive_entry_set_size((archive_entry *)buff,0x801);
      iVar1 = archive_write_header((archive *)ae,(archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ɲ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",ae);
      archive_entry_free((archive_entry *)buff);
      memset(&a,0x5a,0x400);
      lVar3 = archive_write_data((archive *)ae,&a,0x400);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ơ',0x400,"1024",lVar3,"archive_write_data(a, data, 1024)",ae);
      buff = (uchar *)archive_entry_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                       ,L'Ʀ',(uint)((archive_entry *)buff != (archive_entry *)0x0),
                       "(ae = archive_entry_new()) != NULL",(void *)0x0);
      archive_entry_set_atime((archive_entry *)buff,2,0x14);
      archive_entry_set_birthtime((archive_entry *)buff,3,0x1e);
      archive_entry_set_ctime((archive_entry *)buff,4,0x28);
      archive_entry_set_mtime((archive_entry *)buff,5,0x32);
      archive_entry_copy_pathname((archive_entry *)buff,"file4");
      archive_entry_set_mode((archive_entry *)buff,0x81ed);
      archive_entry_set_size((archive_entry *)buff,0x18);
      iVar1 = archive_write_header((archive *)ae,(archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ʈ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",ae);
      archive_entry_free((archive_entry *)buff);
      lVar3 = archive_write_data((archive *)ae,zisofs_data,0x18);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ư',0x18,"24",lVar3,"archive_write_data(a, zisofs_data, 24)",ae);
      iVar1 = archive_write_close((archive *)ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ƴ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",ae);
      iVar1 = archive_write_free((archive *)ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ƴ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",ae);
      failure("The ISO image size should be 110592 bytes.");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ʒ',_r,"used",0x1b000,"2048 * 54",(void *)0x0);
      for (j = 0; (uint)j < 0x8000; j = j + 1) {
        failure("System Area should be all nulls.");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                            ,L'Ƽ',(ulong)*(byte *)(buffsize + (uint)j),"buff[i]",0,"0",(void *)0x0)
        ;
      }
      failure("Primary Volume Descriptor should be in 16 Logical Sector.");
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ǁ',(void *)(buffsize + 0x8000),"buff+2048*16","\x01CD001\x01",
                          "primary_id",8,"8",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ǃ',(void *)(buffsize + 0x8028),"buff+2048*16+0x28",
                          "CDROM                           ","\"CDROM                           \"",
                          0x20,"32",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ǆ',(void *)(buffsize + 0x8050),"buff+2048*16+0x50","6","volumesize2",8
                          ,"8",(void *)0x0);
      failure("Supplementary Volume(Joliet) Descriptor should be in 17 Logical Sector.");
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ǉ',(void *)(buffsize + 0x8800),"buff+2048*17","\x02CD001\x01",
                          "supplementary_id",8,"8",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ǌ',(void *)(buffsize + 0x8828),"buff+2048*17+0x28","","volumeidu16",
                          0x20,"32",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ǋ',(void *)(buffsize + 0x8850),"buff+2048*17+0x50","6","volumesize2",8
                          ,"8",(void *)0x0);
      failure(
             "Date and Time of Primary Volume and Date and Time of Supplementary Volume must be the same."
             );
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ǐ',(void *)(buffsize + 0x832d),"buff+2048*16+0x32d",
                          (void *)(buffsize + 0x8b2d),"buff+2048*17+0x32d",0x44,"0x44",(void *)0x0);
      failure("Volume Descriptor Set Terminator should be in 18 Logical Sector.");
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ǔ',(void *)(buffsize + 0x9000),"buff+2048*18",terminator_id,
                          "terminator_id",8,"8",(void *)0x0);
      for (j = 8; (uint)j < 0x800; j = j + 1) {
        failure("Body of Volume Descriptor Set Terminator should be all nulls.");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                            ,L'ǘ',(ulong)*(byte *)(buffsize + (j + 0x9000)),"buff[2048*18+i]",0,"0"
                            ,(void *)0x0);
      }
      failure("file1 image should be zisofs\'ed.");
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ǝ',(void *)(buffsize + 0xf800),"buff+2048*31",zisofs_magic,
                          "zisofs_magic",8,"8",(void *)0x0);
      memset(&a,0x61,0x400);
      failure("file2 image should not be zisofs\'ed.");
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ǡ',(void *)(buffsize + 0x19800),"buff+2048*51",&a,"data",0x400,"1024",
                          (void *)0x0);
      memset(&a,0x62,0x400);
      failure("file2 image should not be zisofs\'ed.");
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ǥ',(void *)(buffsize + 0x19c00),"buff+2048*51+1024",&a,"data",0x400,
                          "1024",(void *)0x0);
      failure("file3 image should be zisofs\'ed.");
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ǧ',(void *)(buffsize + 0x1a000),"buff+2048*52",zisofs_magic,
                          "zisofs_magic",8,"8",(void *)0x0);
      failure("file4 image should be zisofs\'ed.");
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ǫ',(void *)(buffsize + 0x1a800),"buff+2048*53",zisofs_magic,
                          "zisofs_magic",8,"8",(void *)0x0);
      ae = (archive_entry *)archive_read_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                       ,L'ǯ',(uint)(ae != (archive_entry *)0x0),"(a = archive_read_new()) != NULL",
                       (void *)0x0);
      iVar1 = archive_read_support_format_all((archive *)ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ǰ',0,"0",(long)iVar1,"archive_read_support_format_all(a)",ae);
      iVar1 = archive_read_support_filter_all((archive *)ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ǳ',0,"0",(long)iVar1,"archive_read_support_filter_all(a)",ae);
      iVar1 = archive_read_open_memory((archive *)ae,(void *)buffsize,_r);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ǲ',0,"0",(long)iVar1,"archive_read_open_memory(a, buff, used)",ae);
      iVar1 = archive_read_next_header((archive *)ae,(archive_entry **)&buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ǹ',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
      tVar4 = archive_entry_atime((archive_entry *)buff);
      tVar5 = archive_entry_ctime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ǹ',tVar4,"archive_entry_atime(ae)",tVar5,"archive_entry_ctime(ae)",
                          (void *)0x0);
      tVar4 = archive_entry_atime((archive_entry *)buff);
      tVar5 = archive_entry_mtime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ǻ',tVar4,"archive_entry_atime(ae)",tVar5,"archive_entry_mtime(ae)",
                          (void *)0x0);
      pcVar6 = archive_entry_pathname((archive_entry *)buff);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                 ,L'ǻ',".","\".\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      mVar2 = archive_entry_mode((archive_entry *)buff);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                       ,L'Ǽ',(uint)(mVar2 == 0x416d),"(S_IFDIR | 0555) == archive_entry_mode(ae)",
                       (void *)0x0);
      lVar7 = archive_entry_size((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ǽ',0x800,"2048",lVar7,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header((archive *)ae,(archive_entry **)&buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ȃ',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
      tVar4 = archive_entry_atime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ȃ',2,"2",tVar4,"archive_entry_atime(ae)",(void *)0x0);
      tVar4 = archive_entry_ctime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ȅ',4,"4",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
      tVar4 = archive_entry_mtime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ȅ',5,"5",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
      pcVar6 = archive_entry_pathname((archive_entry *)buff);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                 ,L'Ȇ',"file1","\"file1\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      mVar2 = archive_entry_mode((archive_entry *)buff);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                       ,L'ȇ',(uint)(mVar2 == 0x816d),"(S_IFREG | 0555) == archive_entry_mode(ae)",
                       (void *)0x0);
      lVar7 = archive_entry_size((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ȉ',0x40000,"256*1024",lVar7,"archive_entry_size(ae)",(void *)0x0);
      lVar3 = archive_read_data((archive *)ae,data + 0x3f8,0x400);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ȉ',0x400,"1024",lVar3,"archive_read_data(a, buff2, 1024)",ae);
      iVar1 = archive_read_next_header((archive *)ae,(archive_entry **)&buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ȏ',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
      tVar4 = archive_entry_atime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ȏ',2,"2",tVar4,"archive_entry_atime(ae)",(void *)0x0);
      tVar4 = archive_entry_ctime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ȑ',4,"4",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
      tVar4 = archive_entry_mtime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ȑ',5,"5",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
      pcVar6 = archive_entry_pathname((archive_entry *)buff);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                 ,L'Ȓ',"file2","\"file2\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      mVar2 = archive_entry_mode((archive_entry *)buff);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                       ,L'ȓ',(uint)(mVar2 == 0x816d),"(S_IFREG | 0555) == archive_entry_mode(ae)",
                       (void *)0x0);
      lVar7 = archive_entry_size((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ȕ',0x800,"2048",lVar7,"archive_entry_size(ae)",(void *)0x0);
      lVar3 = archive_read_data((archive *)ae,data + 0x3f8,0x400);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ȕ',0x400,"1024",lVar3,"archive_read_data(a, buff2, 1024)",ae);
      memset(&a,0x61,0x400);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ȗ',data + 0x3f8,"buff2",&a,"data",0x400,"1024",(void *)0x0);
      iVar1 = archive_read_next_header((archive *)ae,(archive_entry **)&buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ȝ',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
      tVar4 = archive_entry_atime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ȝ',2,"2",tVar4,"archive_entry_atime(ae)",(void *)0x0);
      tVar4 = archive_entry_ctime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ȟ',4,"4",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
      tVar4 = archive_entry_mtime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ȟ',5,"5",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
      pcVar6 = archive_entry_pathname((archive_entry *)buff);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                 ,L'Ƞ',"file3","\"file3\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      mVar2 = archive_entry_mode((archive_entry *)buff);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                       ,L'ȡ',(uint)(mVar2 == 0x816d),"(S_IFREG | 0555) == archive_entry_mode(ae)",
                       (void *)0x0);
      lVar7 = archive_entry_size((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ȣ',0x801,"2049",lVar7,"archive_entry_size(ae)",(void *)0x0);
      lVar3 = archive_read_data((archive *)ae,data + 0x3f8,0x400);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ȣ',0x400,"1024",lVar3,"archive_read_data(a, buff2, 1024)",ae);
      memset(&a,0x5a,0x400);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ȥ',data + 0x3f8,"buff2",&a,"data",0x400,"1024",(void *)0x0);
      iVar1 = archive_read_next_header((archive *)ae,(archive_entry **)&buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ȫ',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
      tVar4 = archive_entry_atime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ȫ',2,"2",tVar4,"archive_entry_atime(ae)",(void *)0x0);
      tVar4 = archive_entry_ctime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ȭ',4,"4",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
      tVar4 = archive_entry_mtime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ȭ',5,"5",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
      pcVar6 = archive_entry_pathname((archive_entry *)buff);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                 ,L'Ȯ',"file4","\"file4\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      mVar2 = archive_entry_mode((archive_entry *)buff);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                       ,L'ȯ',(uint)(mVar2 == 0x816d),"(S_IFREG | 0555) == archive_entry_mode(ae)",
                       (void *)0x0);
      lVar7 = archive_entry_size((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ȱ',0x8000,"32768",lVar7,"archive_entry_size(ae)",(void *)0x0);
      lVar3 = archive_read_data((archive *)ae,data + 0x3f8,0x400);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ȱ',0x400,"1024",lVar3,"archive_read_data(a, buff2, 1024)",ae);
      memset(&a,0,0x400);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ȳ',data + 0x3f8,"buff2",&a,"data",0x400,"1024",(void *)0x0);
      iVar1 = archive_read_next_header((archive *)ae,(archive_entry **)&buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ȸ',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
      iVar1 = archive_read_close((archive *)ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ȹ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",ae);
      iVar1 = archive_read_free((archive *)ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ⱥ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",ae);
      free((void *)buffsize);
    }
  }
  return;
}

Assistant:

static void
test_write_format_iso9660_zisofs_2(void)
{
	unsigned char buff2[1024];
	unsigned char data[1024];
	struct archive *a;
	struct archive_entry *ae;
	unsigned char *buff;
	size_t buffsize = 60 * 2048;
	size_t used;
	unsigned int i;
	int r;

	buff = malloc(buffsize);
	assert(buff != NULL);
	if (buff == NULL)
		return;

	/* ISO9660 format: Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, 0, archive_write_set_format_iso9660(a));
	assertEqualIntA(a, 0, archive_write_add_filter_none(a));
	r = archive_write_set_option(a, NULL, "zisofs", "1");
	if (r == ARCHIVE_FATAL) {
		skipping("zisofs option not supported on this platform");
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
		free(buff);
		return;
	}
	assertEqualIntA(a, 0, archive_write_set_option(a, NULL, "pad", NULL));
	assertEqualIntA(a, 0, archive_write_open_memory(a, buff, buffsize, &used));

	/*
	 * "file1" has a bunch of attributes and 256K bytes of random data.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 20);
	archive_entry_set_birthtime(ae, 3, 30);
	archive_entry_set_ctime(ae, 4, 40);
	archive_entry_set_mtime(ae, 5, 50);
	archive_entry_copy_pathname(ae, "file1");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 256*1024);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	for (i = 0; i < 256; i++) {
		int j;
		if (i == 0) {
			for (j = 0; j < (int)sizeof(data); j++)
				data[j] = (i^j) & 0xff;
		} else {
			for (j = 0; j < (int)sizeof(data); j++)
				data[j] ^= i+j;
		}
		assertEqualIntA(a, 1024, archive_write_data(a, data, 1024));
	}

	/*
	 * "file2" has a bunch of attributes and 2048 bytes data.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 20);
	archive_entry_set_birthtime(ae, 3, 30);
	archive_entry_set_ctime(ae, 4, 40);
	archive_entry_set_mtime(ae, 5, 50);
	archive_entry_copy_pathname(ae, "file2");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 2048);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	memset(data, 'a', sizeof(data));
	assertEqualIntA(a, 1024, archive_write_data(a, data, 1024));
	memset(data, 'b', sizeof(data));
	assertEqualIntA(a, 1024, archive_write_data(a, data, 1024));

	/*
	 * "file3" has a bunch of attributes and 1024 bytes of 'Z'
	 *  + 1025 bytes of null data.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 20);
	archive_entry_set_birthtime(ae, 3, 30);
	archive_entry_set_ctime(ae, 4, 40);
	archive_entry_set_mtime(ae, 5, 50);
	archive_entry_copy_pathname(ae, "file3");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 2049);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	memset(data, 'Z', sizeof(data));
	assertEqualIntA(a, 1024, archive_write_data(a, data, 1024));

	/*
	 * "file4" has a bunch of attributes and 24 bytes of zisofs data
	 * which is compressed from 32K bytes null data.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 20);
	archive_entry_set_birthtime(ae, 3, 30);
	archive_entry_set_ctime(ae, 4, 40);
	archive_entry_set_mtime(ae, 5, 50);
	archive_entry_copy_pathname(ae, "file4");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 24);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 24, archive_write_data(a, zisofs_data, 24));

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_free(a));

	failure("The ISO image size should be 110592 bytes.");
	assertEqualInt(used, 2048 * 54);

	/* Check System Area. */
	for (i = 0; i < 2048 * 16; i++) {
		failure("System Area should be all nulls.");
		assertEqualInt(buff[i], 0);
	}

	/* Primary Volume. */
	failure("Primary Volume Descriptor should be in 16 Logical Sector.");
	assertEqualMem(buff+2048*16, primary_id, 8);
	assertEqualMem(buff+2048*16+0x28,
	    "CDROM                           ", 32);
	assertEqualMem(buff+2048*16+0x50, volumesize2, 8);

	/* Supplementary Volume. */
	failure("Supplementary Volume(Joliet) Descriptor "
	    "should be in 17 Logical Sector.");
	assertEqualMem(buff+2048*17, supplementary_id, 8);
	assertEqualMem(buff+2048*17+0x28, volumeidu16, 32);
	assertEqualMem(buff+2048*17+0x50, volumesize2, 8);
	failure("Date and Time of Primary Volume and "
	    "Date and Time of Supplementary Volume "
	    "must be the same.");
	assertEqualMem(buff+2048*16+0x32d, buff+2048*17+0x32d, 0x44);

	/* Terminator. */
	failure("Volume Descriptor Set Terminator "
	    "should be in 18 Logical Sector.");
	assertEqualMem(buff+2048*18, terminator_id, 8);
	for (i = 8; i < 2048; i++) {
		failure("Body of Volume Descriptor Set Terminator "
		    "should be all nulls.");
		assertEqualInt(buff[2048*18+i], 0);
	}

	/* "file1"  Contents is zisofs data. */
	failure("file1 image should be zisofs'ed.");
	assertEqualMem(buff+2048*31, zisofs_magic, 8);
	/* "file2"  Contents is not zisofs data. */
	memset(data, 'a', sizeof(data));
	failure("file2 image should not be zisofs'ed.");
	assertEqualMem(buff+2048*51, data, 1024);
	memset(data, 'b', sizeof(data));
	failure("file2 image should not be zisofs'ed.");
	assertEqualMem(buff+2048*51+1024, data, 1024);
	/* "file3"  Contents is zisofs data. */
	failure("file3 image should be zisofs'ed.");
	assertEqualMem(buff+2048*52, zisofs_magic, 8);
	/* "file4"  Contents is zisofs data. */
	failure("file4 image should be zisofs'ed.");
	assertEqualMem(buff+2048*53, zisofs_magic, 8);

	/*
	 * Read ISO image.
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, 0, archive_read_support_format_all(a));
	assertEqualIntA(a, 0, archive_read_support_filter_all(a));
	assertEqualIntA(a, 0, archive_read_open_memory(a, buff, used));

	/*
	 * Read Root Directory
	 * Root Directory entry must be in ISO image.
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualInt(archive_entry_atime(ae), archive_entry_ctime(ae));
	assertEqualInt(archive_entry_atime(ae), archive_entry_mtime(ae));
	assertEqualString(".", archive_entry_pathname(ae));
	assert((S_IFDIR | 0555) == archive_entry_mode(ae));
	assertEqualInt(2048, archive_entry_size(ae));

	/*
	 * Read "file1" which has 256K bytes random data.
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualInt(2, archive_entry_atime(ae));
	assertEqualInt(4, archive_entry_ctime(ae));
	assertEqualInt(5, archive_entry_mtime(ae));
	assertEqualString("file1", archive_entry_pathname(ae));
	assert((S_IFREG | 0555) == archive_entry_mode(ae));
	assertEqualInt(256*1024, archive_entry_size(ae));
	assertEqualIntA(a, 1024, archive_read_data(a, buff2, 1024));

	/*
	 * Read "file2" which has 2048 bytes data.
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualInt(2, archive_entry_atime(ae));
	assertEqualInt(4, archive_entry_ctime(ae));
	assertEqualInt(5, archive_entry_mtime(ae));
	assertEqualString("file2", archive_entry_pathname(ae));
	assert((S_IFREG | 0555) == archive_entry_mode(ae));
	assertEqualInt(2048, archive_entry_size(ae));
	assertEqualIntA(a, 1024, archive_read_data(a, buff2, 1024));
	memset(data, 'a', sizeof(data));
	assertEqualMem(buff2, data, 1024);

	/*
	 * Read "file3" which has 2049 bytes data.
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualInt(2, archive_entry_atime(ae));
	assertEqualInt(4, archive_entry_ctime(ae));
	assertEqualInt(5, archive_entry_mtime(ae));
	assertEqualString("file3", archive_entry_pathname(ae));
	assert((S_IFREG | 0555) == archive_entry_mode(ae));
	assertEqualInt(2049, archive_entry_size(ae));
	assertEqualIntA(a, 1024, archive_read_data(a, buff2, 1024));
	memset(data, 'Z', sizeof(data));
	assertEqualMem(buff2, data, 1024);

	/*
	 * Read "file4" which has 32K bytes null data.
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualInt(2, archive_entry_atime(ae));
	assertEqualInt(4, archive_entry_ctime(ae));
	assertEqualInt(5, archive_entry_mtime(ae));
	assertEqualString("file4", archive_entry_pathname(ae));
	assert((S_IFREG | 0555) == archive_entry_mode(ae));
	assertEqualInt(32768, archive_entry_size(ae));
	assertEqualIntA(a, 1024, archive_read_data(a, buff2, 1024));
	memset(data, 0, sizeof(data));
	assertEqualMem(buff2, data, 1024);

	/*
	 * Verify the end of the archive.
	 */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));

	free(buff);
}